

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

Time __thiscall absl::DeadlineFromTimeout(absl *this,Duration timeout)

{
  __suseconds_t extraout_RDX;
  timeval tv_00;
  Time TVar1;
  Duration DVar2;
  Time lhs;
  timeval tv;
  timeval local_28;
  
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  tv_00.tv_usec = extraout_RDX;
  tv_00.tv_sec = local_28.tv_usec;
  TVar1 = TimeFromTimeval((absl *)local_28.tv_sec,tv_00);
  lhs.rep_._12_4_ = 0;
  lhs.rep_.rep_hi_ = SUB128(TVar1.rep_._0_12_,0);
  lhs.rep_.rep_lo_ = SUB124(TVar1.rep_._0_12_,8);
  DVar2._8_8_ = timeout.rep_hi_ & 0xffffffff;
  DVar2.rep_hi_ = (int64_t)this;
  DVar2 = (Duration)operator+(lhs,DVar2);
  return (Time)DVar2;
}

Assistant:

static absl::Time DeadlineFromTimeout(absl::Duration timeout) {
#ifndef _WIN32
  struct timeval tv;
  gettimeofday(&tv, nullptr);
  return absl::TimeFromTimeval(tv) + timeout;
#else
  return absl::Now() + timeout;
#endif
}